

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O2

void __thiscall
duckdb::FixedSizeAllocator::FixedSizeAllocator
          (FixedSizeAllocator *this,idx_t segment_size,BlockManager *block_manager)

{
  idx_t iVar1;
  ulong uVar2;
  InternalException *this_00;
  ulong uVar3;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->block_manager = block_manager;
  this->buffer_manager = block_manager->buffer_manager;
  this->segment_size = segment_size;
  this->total_segment_count = 0;
  (this->buffers)._M_h._M_buckets = &(this->buffers)._M_h._M_single_bucket;
  (this->buffers)._M_h._M_bucket_count = 1;
  (this->buffers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->buffers)._M_h._M_element_count = 0;
  (this->buffers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->buffers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->buffers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->buffers_with_free_space)._M_h._M_buckets =
       &(this->buffers_with_free_space)._M_h._M_single_bucket;
  (this->buffers_with_free_space)._M_h._M_bucket_count = 1;
  (this->buffers_with_free_space)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->buffers_with_free_space)._M_h._M_element_count = 0;
  (this->buffers_with_free_space)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->buffers_with_free_space)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->buffers_with_free_space)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->buffer_with_free_space).index = 0xffffffffffffffff;
  (this->vacuum_buffers)._M_h._M_buckets = &(this->vacuum_buffers)._M_h._M_single_bucket;
  (this->vacuum_buffers)._M_h._M_bucket_count = 1;
  (this->vacuum_buffers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->vacuum_buffers)._M_h._M_element_count = 0;
  (this->vacuum_buffers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->vacuum_buffers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->vacuum_buffers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  iVar1 = BlockManager::GetBlockSize(block_manager);
  if (iVar1 - 8 < segment_size) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    iVar1 = BlockManager::GetBlockSize(block_manager);
    ::std::__cxx11::to_string(&local_70,iVar1 - 8);
    ::std::operator+(&local_50,"The maximum segment size of fixed-size allocators is ",&local_70);
    InternalException::InternalException(this_00,&local_50);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this->bitmask_count = 0;
  this->available_segments_per_buffer = 0;
  uVar3 = 0;
  while( true ) {
    iVar1 = BlockManager::GetBlockSize(block_manager);
    if (iVar1 <= uVar3) break;
    iVar1 = this->bitmask_count;
    if ((iVar1 == 0) || ((iVar1 << 6) % this->available_segments_per_buffer == 0)) {
      this->bitmask_count = iVar1 + 1;
      uVar3 = uVar3 + 8;
    }
    iVar1 = BlockManager::GetBlockSize(block_manager);
    if (iVar1 - uVar3 < segment_size) break;
    uVar2 = (iVar1 - uVar3) / segment_size;
    if (0x3f < uVar2) {
      uVar2 = 0x40;
    }
    this->available_segments_per_buffer = this->available_segments_per_buffer + uVar2;
    uVar3 = uVar3 + uVar2 * segment_size;
  }
  this->bitmask_offset = this->bitmask_count << 3;
  return;
}

Assistant:

FixedSizeAllocator::FixedSizeAllocator(const idx_t segment_size, BlockManager &block_manager)
    : block_manager(block_manager), buffer_manager(block_manager.buffer_manager), segment_size(segment_size),
      total_segment_count(0) {

	if (segment_size > block_manager.GetBlockSize() - sizeof(validity_t)) {
		throw InternalException("The maximum segment size of fixed-size allocators is " +
		                        to_string(block_manager.GetBlockSize() - sizeof(validity_t)));
	}

	// calculate how many segments fit into one buffer (available_segments_per_buffer)

	idx_t bits_per_value = sizeof(validity_t) * 8;
	idx_t byte_count = 0;

	bitmask_count = 0;
	available_segments_per_buffer = 0;

	while (byte_count < block_manager.GetBlockSize()) {
		if (!bitmask_count || (bitmask_count * bits_per_value) % available_segments_per_buffer == 0) {
			// we need to add another validity_t value to the bitmask, to allow storing another
			// bits_per_value segments on a buffer
			bitmask_count++;
			byte_count += sizeof(validity_t);
		}

		auto remaining_bytes = block_manager.GetBlockSize() - byte_count;
		auto remaining_segments = MinValue(remaining_bytes / segment_size, bits_per_value);

		if (remaining_segments == 0) {
			break;
		}

		available_segments_per_buffer += remaining_segments;
		byte_count += remaining_segments * segment_size;
	}

	bitmask_offset = bitmask_count * sizeof(validity_t);
}